

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_bone.cxx
# Opt level: O0

void __thiscall xray_re::xr_bone::save_data(xr_bone *this,xr_writer *w)

{
  anon_struct_8_2_947311e6_for_anon_union_8_3_f28016de_for__vector2<float>_1_0 aVar1;
  undefined4 uStack_24;
  float tmp;
  fvector2 vec;
  int i;
  xr_writer *w_local;
  xr_bone *this_local;
  
  unique0x1000037a = w;
  xr_writer::w_chunk(w,2,&this->m_name);
  xr_writer::w_chunk(stack0xffffffffffffffe8,4,&this->m_gamemtl);
  xr_writer::w_chunk<xray_re::s_bone_shape>(stack0xffffffffffffffe8,5,&this->m_shape);
  xr_writer::w_chunk<unsigned_int>(stack0xffffffffffffffe8,8,&(this->m_joint_ik_data).ik_flags);
  xr_writer::open_chunk(stack0xffffffffffffffe8,6);
  xr_writer::w_u32(stack0xffffffffffffffe8,(this->m_joint_ik_data).type);
  for (vec.field_0.field_0.x = 0.0; (int)vec.field_0.field_0.x < 3;
      vec.field_0.field_0.x = (float)((int)vec.field_0.field_0.x + 1)) {
    aVar1 = (this->m_joint_ik_data).limits[(int)vec.field_0.field_0.x].limit.field_0.field_0;
    uStack_24 = aVar1.x;
    tmp = aVar1.y;
    _uStack_24 = (anon_union_8_3_f28016de_for__vector2<float>_1)
                 (CONCAT44(uStack_24,tmp) ^ 0x8000000080000000);
    xr_writer::w_fvector2(stack0xffffffffffffffe8,(fvector2 *)&stack0xffffffffffffffdc);
    xr_writer::w_float(stack0xffffffffffffffe8,
                       (this->m_joint_ik_data).limits[(int)vec.field_0.field_0.x].spring_factor);
    xr_writer::w_float(stack0xffffffffffffffe8,
                       (this->m_joint_ik_data).limits[(int)vec.field_0.field_0.x].damping_factor);
  }
  xr_writer::w_float(stack0xffffffffffffffe8,(this->m_joint_ik_data).spring_factor);
  xr_writer::w_float(stack0xffffffffffffffe8,(this->m_joint_ik_data).damping_factor);
  xr_writer::close_chunk(stack0xffffffffffffffe8);
  xr_writer::open_chunk(stack0xffffffffffffffe8,9);
  xr_writer::w_float(stack0xffffffffffffffe8,(this->m_joint_ik_data).break_force);
  xr_writer::w_float(stack0xffffffffffffffe8,(this->m_joint_ik_data).break_torque);
  xr_writer::close_chunk(stack0xffffffffffffffe8);
  xr_writer::w_chunk<float>(stack0xffffffffffffffe8,0x10,&(this->m_joint_ik_data).friction);
  xr_writer::open_chunk(stack0xffffffffffffffe8,7);
  xr_writer::w_float(stack0xffffffffffffffe8,this->m_mass);
  xr_writer::w_fvector3(stack0xffffffffffffffe8,&this->m_center_of_mass);
  xr_writer::close_chunk(stack0xffffffffffffffe8);
  return;
}

Assistant:

void xr_bone::save_data(xr_writer& w) const
{
	w.w_chunk(BONE_CHUNK_DEF, m_name);	// second type!!!
	w.w_chunk(BONE_CHUNK_MATERIAL, m_gamemtl);
	w.w_chunk<s_bone_shape>(BONE_CHUNK_SHAPE, m_shape);
	w.w_chunk<uint32_t>(BONE_CHUNK_IK_FLAGS, m_joint_ik_data.ik_flags);

	w.open_chunk(BONE_CHUNK_IK_JOINT);
	w.w_u32(m_joint_ik_data.type);

	//w.w_cseq<s_joint_limit>(3, m_joint_ik_data.limits);
	for (int i = 0; i < 3; ++i) //invert limits for AE
	{
		fvector2 vec = m_joint_ik_data.limits[i].limit;
		float tmp = vec.x;
		vec.x = -vec.y;
		vec.y = -tmp;
		w.w_fvector2(vec);
		w.w_float(m_joint_ik_data.limits[i].spring_factor);
		w.w_float(m_joint_ik_data.limits[i].damping_factor);
	}

	w.w_float(m_joint_ik_data.spring_factor);
	w.w_float(m_joint_ik_data.damping_factor);
	w.close_chunk();

	w.open_chunk(BONE_CHUNK_BREAK_PARAMS);
	w.w_float(m_joint_ik_data.break_force);
	w.w_float(m_joint_ik_data.break_torque);
	w.close_chunk();

	w.w_chunk<float>(BONE_CHUNK_FRICTION, m_joint_ik_data.friction);

	w.open_chunk(BONE_CHUNK_MASS_PARAMS);
	w.w_float(m_mass);
	w.w_fvector3(m_center_of_mass);
	w.close_chunk();
}